

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

Gem_Man_t * Gem_ManAlloc(int nVars,int fVerbose)

{
  size_t __size;
  uint uVar1;
  word wVar2;
  uint nRows;
  uint uVar3;
  Gem_Man_t *p;
  Gem_Obj_t *pGVar4;
  word *pwVar5;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  word **ppwVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMaj.c"
                  ,0x5a,"Gem_Man_t *Gem_ManAlloc(int, int)");
  }
  p = (Gem_Man_t *)calloc(1,0x30);
  nRows = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nRows = 1;
  }
  uVar13 = (ulong)nRows;
  p->nVars = nVars;
  p->nWords = nRows;
  p->nObjsAlloc = 10000000;
  p->nObjs = 2;
  pGVar4 = (Gem_Obj_t *)calloc(10000000,8);
  uVar1 = *(uint *)(pGVar4 + 1);
  p->pObjs = pGVar4;
  *(uint *)(pGVar4 + 1) = uVar1 & 0xfff0 | 0x10001;
  __size = uVar13 * 8;
  pwVar5 = (word *)malloc(__size);
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = nRows;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  if ((p_00->vTable != (Vec_Int_t *)0x0) || (p_00->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar1 = 9999;
  while( true ) {
    do {
      uVar10 = uVar1;
      uVar1 = uVar10 + 1;
    } while ((uVar10 & 1) != 0);
    if (uVar1 < 9) break;
    iVar9 = 5;
    while (uVar1 % (iVar9 - 2U) != 0) {
      uVar3 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar1 < uVar3) goto LAB_004851ff;
    }
  }
LAB_004851ff:
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < uVar10) {
    uVar3 = uVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar3;
  piVar7 = (int *)malloc((long)(int)uVar3 << 2);
  pVVar6->pArray = piVar7;
  pVVar6->nSize = uVar1;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,(long)(int)uVar1 << 2);
  }
  p_00->vTable = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 10000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(40000);
  pVVar6->pArray = piVar7;
  p_00->vNexts = pVVar6;
  memset(pwVar5,0,__size);
  iVar9 = Vec_MemHashInsert(p_00,pwVar5);
  if (iVar9 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  memset(pwVar5,0xaa,__size);
  iVar9 = Vec_MemHashInsert(p_00,pwVar5);
  if (iVar9 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  if (pwVar5 != (word *)0x0) {
    free(pwVar5);
  }
  p->vTtMem = p_00;
  ppwVar8 = (word **)Extra_ArrayAlloc(nVars + 4,nRows,8);
  p->pTtElems = ppwVar8;
  p->fVerbose = fVerbose;
  if (0 < nVars) {
    uVar11 = 0;
    do {
      if (uVar11 < 6) {
        if (0 < (int)nRows) {
          wVar2 = s_Truths6[uVar11];
          pwVar5 = ppwVar8[uVar11];
          uVar12 = 0;
          do {
            pwVar5[uVar12] = wVar2;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
        }
      }
      else if (0 < (int)nRows) {
        pwVar5 = ppwVar8[uVar11];
        uVar12 = 0;
        do {
          pwVar5[uVar12] = -(ulong)((1 << ((char)uVar11 - 6U & 0x1f) & (uint)uVar12) != 0);
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)nVars);
  }
  Gem_PrintNode(p,1,"Original",0);
  return p;
}

Assistant:

Gem_Man_t * Gem_ManAlloc( int nVars, int fVerbose )
{
    Gem_Man_t * p;
    assert( nVars <= 16 );
    p = ABC_CALLOC( Gem_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = Abc_TtWordNum( nVars );
    p->nObjsAlloc = 10000000;
    p->nObjs      = 2;
    p->pObjs      = ABC_CALLOC( Gem_Obj_t, p->nObjsAlloc );
    p->pObjs[1].nVars = p->pObjs[1].Groups = 1; // buffer
    p->vTtMem     = Vec_MemAllocForTT( nVars, 0 );
    p->pTtElems   = (word **)Extra_ArrayAlloc( nVars + 4, p->nWords, sizeof(word) );
    p->fVerbose   = fVerbose;
    Abc_TtElemInit( p->pTtElems, nVars );
    Gem_PrintNode( p, 1, "Original", 0 );
    return p;
}